

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void Fixpp::details::
     FromRef<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
     ::copyFieldAt<14ul>(Ref *ref,Message *message)

{
  bool bVar1;
  type_by_index_t<14UL,_Fixpp::FieldRef<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *src;
  type_by_index_t<14UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *dst;
  type_by_index_t<14UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *dstField;
  type_by_index_t<14UL,_Fixpp::FieldRef<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *srcField;
  Message *message_local;
  Ref *ref_local;
  
  bVar1 = std::bitset<24UL>::test
                    (&(ref->
                      super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      ).
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      .allBits,0xe);
  if (bVar1) {
    src = meta::
          get<14ul,Fixpp::FieldRef<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<115u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<128u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<90u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<91u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<50u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<142u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<57u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<143u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<116u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<144u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<129u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<43u,Fixpp::Type::Boolean>>,Fixpp::FieldRef<Fixpp::TagT<97u,Fixpp::Type::Boolean>>,Fixpp::FieldRef<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<212u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<213u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<347u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<369u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
                    ((tuple<Fixpp::FieldRef<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
                      *)ref);
    dst = meta::
          get<14ul,Fixpp::Field<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<115u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<128u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<90u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<91u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<50u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<142u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<57u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<143u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<116u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<144u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<129u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<43u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<97u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<212u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<213u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<347u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<369u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
                    ((tuple<Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
                      *)message);
    copyField<Fixpp::FieldRef<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<145u,Fixpp::Type::String>>>
              (src,dst);
    std::bitset<24UL>::set
              (&(message->
                super_MessageT<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                ).
                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                .allBits,0xe,true);
  }
  return;
}

Assistant:

static void copyFieldAt(const Ref& ref, Message& message)
            {
                if (ref.allBits.test(Index))
                {
                    const auto& srcField = meta::get<Index>(ref.values);
                    auto& dstField = meta::get<Index>(message.values);

                    copyField(srcField, dstField);
                    message.allBits.set(Index);
                }
            }